

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_350569::ImageOptimizer::provideStreamData
          (ImageOptimizer *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  _func_int **pp_Var1;
  shared_ptr<Pipeline> p;
  undefined1 local_48 [32];
  undefined1 local_28 [16];
  
  pp_Var1 = (_func_int **)(local_48 + 0x10);
  local_48._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  makePipeline((ImageOptimizer *)local_28,(string *)this,(Pipeline *)local_48);
  if ((_func_int **)local_48._0_8_ != pp_Var1) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
  }
  if ((Pipeline *)local_28._0_8_ == (Pipeline *)0x0) {
    local_48._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,
               "unable to create pipeline after previous success; image data will be lost","");
    QPDFObjectHandle::warnIfPossible(&this->image,(string *)local_48);
    if ((_func_int **)local_48._0_8_ != pp_Var1) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    (*pipeline->_vptr_Pipeline[3])(pipeline);
  }
  else {
    QPDFObjectHandle::pipeStreamData
              (&this->image,(Pipeline *)local_28._0_8_,0,this->decode_level,false,false);
  }
  if ((Pipeline *)local_28._8_8_ != (Pipeline *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  return;
}

Assistant:

void
ImageOptimizer::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::shared_ptr<Pipeline> p = makePipeline("", pipeline);
    if (p == nullptr) {
        // Should not be possible
        image.warnIfPossible(
            "unable to create pipeline after previous success; image data will be lost");
        pipeline->finish();
        return;
    }
    image.pipeStreamData(p.get(), 0, decode_level, false, false);
}